

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

bool __thiscall Omega_h::InputScalar::as(InputScalar *this,bool *out)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = std::operator==(&this->str,"true");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&this->str,"false");
    bVar2 = false;
    if (!bVar1) {
      return false;
    }
  }
  *out = bVar2;
  return true;
}

Assistant:

bool InputScalar::as(bool& out) const {
  if (str == "true") {
    out = true;
    return true;
  }
  if (str == "false") {
    out = false;
    return true;
  }
  return false;
}